

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::calcDiversity(Population *this)

{
  value_type vVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint64_t total;
  uint64_t numComparisons;
  size_t pos;
  Chromosome *c2;
  Chromosome *c1;
  size_t j;
  size_t i;
  uint64_t sum;
  int populationSize;
  size_t orientationCount;
  Population *this_local;
  
  pvVar3 = std::vector<Chromosome,_std::allocator<Chromosome>_>::front(&this->chromosomes);
  sVar4 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::size(&pvVar3->turnList);
  sVar5 = std::vector<Chromosome,_std::allocator<Chromosome>_>::size(&this->chromosomes);
  iVar2 = (int)sVar5;
  i = 0;
  for (j = 0; c1 = (Chromosome *)j, j < (ulong)(long)iVar2; j = j + 1) {
    while (c1 = (Chromosome *)((long)&c1->id + 1), c1 < (Chromosome *)(long)iVar2) {
      pvVar3 = std::vector<Chromosome,_std::allocator<Chromosome>_>::operator[]
                         (&this->chromosomes,j);
      pvVar6 = std::vector<Chromosome,_std::allocator<Chromosome>_>::operator[]
                         (&this->chromosomes,(size_type)c1);
      for (numComparisons = 0; numComparisons < sVar4; numComparisons = numComparisons + 1) {
        pvVar7 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::operator[]
                           (&pvVar3->turnList,numComparisons);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<TURNCODE,_std::allocator<TURNCODE>_>::operator[]
                           (&pvVar6->turnList,numComparisons);
        if (vVar1 != *pvVar7) {
          i = i + 1;
        }
      }
    }
  }
  lVar8 = (long)(int)(((uint)(iVar2 * iVar2) >> 1) - iVar2 / 2) * sVar4;
  auVar10._8_4_ = (int)(i >> 0x20);
  auVar10._0_8_ = i;
  auVar10._12_4_ = 0x45300000;
  auVar11._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar11._0_8_ = lVar8;
  auVar11._12_4_ = 0x45300000;
  this->diversity =
       (float)(((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)) /
              ((auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
  this->diversity = this->diversity * 100.0;
  fVar9 = roundf(this->diversity);
  this->diversity = fVar9;
  return;
}

Assistant:

void Population::calcDiversity() {


    size_t orientationCount = chromosomes.front().turnList.size();

    int populationSize = (int) chromosomes.size();

    uint64_t sum = 0;

    for (size_t i = 0; i < populationSize; ++i)
    {
        for (size_t j = i + 1; j < populationSize; ++j)
        {
            const Chromosome & c1 = chromosomes[i];
            const Chromosome & c2 = chromosomes[j];

            for (size_t pos = 0; pos < orientationCount; ++pos)
            {
                if (c1.turnList[pos] != c2.turnList[pos])
                {
                    ++sum;
                }
            }
        }
    };

    uint64_t numComparisons = (uint64_t) ((populationSize * populationSize / 2) - (populationSize / 2));

    uint64_t total = numComparisons * orientationCount;

    diversity = static_cast<float>(static_cast<double>(sum) / total);
    diversity *= 100.0f;

    diversity = std::roundf(diversity);

}